

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ChElementShellReissner4(ChElementShellReissner4 *this)

{
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_ChElementShell).mass = 0.0;
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0xb60bc8;
  this->super_ChLoadableUV = (ChLoadableUV)0xb60d98;
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb60e90;
  this->xa_0[0].m_data[0] = 0.0;
  this->xa_0[0].m_data[1] = 0.0;
  this->xa_0[0].m_data[2] = 0.0;
  this->xa_0[1].m_data[0] = 0.0;
  this->xa_0[1].m_data[1] = 0.0;
  this->xa_0[1].m_data[2] = 0.0;
  this->xa_0[2].m_data[0] = 0.0;
  this->xa_0[2].m_data[1] = 0.0;
  this->xa_0[1].m_data[1] = 0.0;
  this->xa_0[1].m_data[2] = 0.0;
  this->xa_0[2].m_data[0] = 0.0;
  this->xa_0[2].m_data[1] = 0.0;
  this->xa_0[2].m_data[2] = 0.0;
  this->xa_0[3].m_data[0] = 0.0;
  this->xa_0[3].m_data[1] = 0.0;
  this->xa_0[3].m_data[2] = 0.0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_layers).
  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tot_thickness = 0.0;
  this->xa[0].m_data[0] = 0.0;
  this->xa[0].m_data[1] = 0.0;
  this->xa[0].m_data[2] = 0.0;
  this->xa[1].m_data[0] = 0.0;
  this->xa[1].m_data[1] = 0.0;
  this->xa[1].m_data[2] = 0.0;
  this->xa[2].m_data[0] = 0.0;
  this->xa[2].m_data[1] = 0.0;
  this->xa[1].m_data[1] = 0.0;
  this->xa[1].m_data[2] = 0.0;
  this->xa[2].m_data[0] = 0.0;
  this->xa[2].m_data[1] = 0.0;
  this->xa[2].m_data[2] = 0.0;
  this->xa[3].m_data[0] = 0.0;
  this->xa[3].m_data[1] = 0.0;
  this->xa[3].m_data[2] = 0.0;
  this->phi_tilde_n[0].m_data[0] = 0.0;
  this->phi_tilde_n[0].m_data[1] = 0.0;
  this->phi_tilde_n[0].m_data[2] = 0.0;
  this->phi_tilde_n[1].m_data[0] = 0.0;
  this->phi_tilde_n[1].m_data[1] = 0.0;
  this->phi_tilde_n[1].m_data[2] = 0.0;
  this->phi_tilde_n[2].m_data[0] = 0.0;
  this->phi_tilde_n[2].m_data[1] = 0.0;
  this->phi_tilde_n[1].m_data[1] = 0.0;
  this->phi_tilde_n[1].m_data[2] = 0.0;
  this->phi_tilde_n[2].m_data[0] = 0.0;
  this->phi_tilde_n[2].m_data[1] = 0.0;
  this->phi_tilde_n[2].m_data[2] = 0.0;
  this->phi_tilde_n[3].m_data[0] = 0.0;
  this->phi_tilde_n[3].m_data[1] = 0.0;
  this->phi_tilde_n[3].m_data[2] = 0.0;
  this->phi_tilde_i[0].m_data[0] = 0.0;
  this->phi_tilde_i[0].m_data[1] = 0.0;
  this->phi_tilde_i[0].m_data[2] = 0.0;
  this->phi_tilde_i[1].m_data[0] = 0.0;
  this->phi_tilde_i[1].m_data[1] = 0.0;
  this->phi_tilde_i[1].m_data[2] = 0.0;
  this->phi_tilde_i[2].m_data[0] = 0.0;
  this->phi_tilde_i[2].m_data[1] = 0.0;
  this->phi_tilde_i[1].m_data[1] = 0.0;
  this->phi_tilde_i[1].m_data[2] = 0.0;
  this->phi_tilde_i[2].m_data[0] = 0.0;
  this->phi_tilde_i[2].m_data[1] = 0.0;
  this->phi_tilde_i[2].m_data[2] = 0.0;
  this->phi_tilde_i[3].m_data[0] = 0.0;
  this->phi_tilde_i[3].m_data[1] = 0.0;
  this->phi_tilde_i[3].m_data[2] = 0.0;
  this->phi_tilde_A[1].m_data[1] = 0.0;
  this->phi_tilde_A[1].m_data[2] = 0.0;
  this->phi_tilde_A[2].m_data[0] = 0.0;
  this->phi_tilde_A[2].m_data[1] = 0.0;
  this->phi_tilde_A[2].m_data[2] = 0.0;
  this->phi_tilde_A[3].m_data[0] = 0.0;
  this->phi_tilde_A[3].m_data[1] = 0.0;
  this->phi_tilde_A[3].m_data[2] = 0.0;
  this->phi_tilde_A[0].m_data[0] = 0.0;
  this->phi_tilde_A[0].m_data[1] = 0.0;
  this->phi_tilde_A[0].m_data[2] = 0.0;
  this->phi_tilde_A[1].m_data[0] = 0.0;
  this->phi_tilde_A[1].m_data[1] = 0.0;
  this->phi_tilde_A[1].m_data[2] = 0.0;
  this->phi_tilde_A[2].m_data[0] = 0.0;
  this->phi_tilde_A[2].m_data[1] = 0.0;
  (this->phi_tilde_0).m_data[2] = 0.0;
  *(undefined1 (*) [16])(this->phi_tilde_0).m_data = ZEXT416(0) << 0x40;
  this->k_1_i[1].m_data[1] = 0.0;
  this->k_1_i[1].m_data[2] = 0.0;
  this->k_1_i[2].m_data[0] = 0.0;
  this->k_1_i[2].m_data[1] = 0.0;
  this->k_1_i[2].m_data[2] = 0.0;
  this->k_1_i[3].m_data[0] = 0.0;
  this->k_1_i[3].m_data[1] = 0.0;
  this->k_1_i[3].m_data[2] = 0.0;
  this->k_1_i[0].m_data[0] = 0.0;
  this->k_1_i[0].m_data[1] = 0.0;
  this->k_1_i[0].m_data[2] = 0.0;
  this->k_1_i[1].m_data[0] = 0.0;
  this->k_1_i[1].m_data[1] = 0.0;
  this->k_1_i[1].m_data[2] = 0.0;
  this->k_1_i[2].m_data[0] = 0.0;
  this->k_1_i[2].m_data[1] = 0.0;
  this->k_2_i[1].m_data[1] = 0.0;
  this->k_2_i[1].m_data[2] = 0.0;
  this->k_2_i[2].m_data[0] = 0.0;
  this->k_2_i[2].m_data[1] = 0.0;
  this->k_2_i[2].m_data[2] = 0.0;
  this->k_2_i[3].m_data[0] = 0.0;
  this->k_2_i[3].m_data[1] = 0.0;
  this->k_2_i[3].m_data[2] = 0.0;
  this->k_2_i[0].m_data[0] = 0.0;
  this->k_2_i[0].m_data[1] = 0.0;
  this->k_2_i[0].m_data[2] = 0.0;
  this->k_2_i[1].m_data[0] = 0.0;
  this->k_2_i[1].m_data[1] = 0.0;
  this->k_2_i[1].m_data[2] = 0.0;
  this->k_2_i[2].m_data[0] = 0.0;
  this->k_2_i[2].m_data[1] = 0.0;
  this->eps_tilde_1_0_i[1].m_data[1] = 0.0;
  this->eps_tilde_1_0_i[1].m_data[2] = 0.0;
  this->eps_tilde_1_0_i[2].m_data[0] = 0.0;
  this->eps_tilde_1_0_i[2].m_data[1] = 0.0;
  this->eps_tilde_1_0_i[2].m_data[2] = 0.0;
  this->eps_tilde_1_0_i[3].m_data[0] = 0.0;
  this->eps_tilde_1_0_i[3].m_data[1] = 0.0;
  this->eps_tilde_1_0_i[3].m_data[2] = 0.0;
  this->eps_tilde_1_0_i[0].m_data[0] = 0.0;
  this->eps_tilde_1_0_i[0].m_data[1] = 0.0;
  this->eps_tilde_1_0_i[0].m_data[2] = 0.0;
  this->eps_tilde_1_0_i[1].m_data[0] = 0.0;
  this->eps_tilde_1_0_i[1].m_data[1] = 0.0;
  this->eps_tilde_1_0_i[1].m_data[2] = 0.0;
  this->eps_tilde_1_0_i[2].m_data[0] = 0.0;
  this->eps_tilde_1_0_i[2].m_data[1] = 0.0;
  this->eps_tilde_2_0_i[1].m_data[1] = 0.0;
  this->eps_tilde_2_0_i[1].m_data[2] = 0.0;
  this->eps_tilde_2_0_i[2].m_data[0] = 0.0;
  this->eps_tilde_2_0_i[2].m_data[1] = 0.0;
  this->eps_tilde_2_0_i[2].m_data[2] = 0.0;
  this->eps_tilde_2_0_i[3].m_data[0] = 0.0;
  this->eps_tilde_2_0_i[3].m_data[1] = 0.0;
  this->eps_tilde_2_0_i[3].m_data[2] = 0.0;
  this->eps_tilde_2_0_i[0].m_data[0] = 0.0;
  this->eps_tilde_2_0_i[0].m_data[1] = 0.0;
  this->eps_tilde_2_0_i[0].m_data[2] = 0.0;
  this->eps_tilde_2_0_i[1].m_data[0] = 0.0;
  this->eps_tilde_2_0_i[1].m_data[1] = 0.0;
  this->eps_tilde_2_0_i[1].m_data[2] = 0.0;
  this->eps_tilde_2_0_i[2].m_data[0] = 0.0;
  this->eps_tilde_2_0_i[2].m_data[1] = 0.0;
  this->eps_tilde_1_0_A[1].m_data[1] = 0.0;
  this->eps_tilde_1_0_A[1].m_data[2] = 0.0;
  this->eps_tilde_1_0_A[2].m_data[0] = 0.0;
  this->eps_tilde_1_0_A[2].m_data[1] = 0.0;
  this->eps_tilde_1_0_A[2].m_data[2] = 0.0;
  this->eps_tilde_1_0_A[3].m_data[0] = 0.0;
  this->eps_tilde_1_0_A[3].m_data[1] = 0.0;
  this->eps_tilde_1_0_A[3].m_data[2] = 0.0;
  this->eps_tilde_1_0_A[0].m_data[0] = 0.0;
  this->eps_tilde_1_0_A[0].m_data[1] = 0.0;
  this->eps_tilde_1_0_A[0].m_data[2] = 0.0;
  this->eps_tilde_1_0_A[1].m_data[0] = 0.0;
  this->eps_tilde_1_0_A[1].m_data[1] = 0.0;
  this->eps_tilde_1_0_A[1].m_data[2] = 0.0;
  this->eps_tilde_1_0_A[2].m_data[0] = 0.0;
  this->eps_tilde_1_0_A[2].m_data[1] = 0.0;
  this->eps_tilde_2_0_A[1].m_data[1] = 0.0;
  this->eps_tilde_2_0_A[1].m_data[2] = 0.0;
  this->eps_tilde_2_0_A[2].m_data[0] = 0.0;
  this->eps_tilde_2_0_A[2].m_data[1] = 0.0;
  this->eps_tilde_2_0_A[2].m_data[2] = 0.0;
  this->eps_tilde_2_0_A[3].m_data[0] = 0.0;
  this->eps_tilde_2_0_A[3].m_data[1] = 0.0;
  this->eps_tilde_2_0_A[3].m_data[2] = 0.0;
  this->eps_tilde_2_0_A[0].m_data[0] = 0.0;
  this->eps_tilde_2_0_A[0].m_data[1] = 0.0;
  this->eps_tilde_2_0_A[0].m_data[2] = 0.0;
  this->eps_tilde_2_0_A[1].m_data[0] = 0.0;
  this->eps_tilde_2_0_A[1].m_data[1] = 0.0;
  this->eps_tilde_2_0_A[1].m_data[2] = 0.0;
  this->eps_tilde_2_0_A[2].m_data[0] = 0.0;
  this->eps_tilde_2_0_A[2].m_data[1] = 0.0;
  this->eps_tilde_1_i[1].m_data[1] = 0.0;
  this->eps_tilde_1_i[1].m_data[2] = 0.0;
  this->eps_tilde_1_i[2].m_data[0] = 0.0;
  this->eps_tilde_1_i[2].m_data[1] = 0.0;
  this->eps_tilde_1_i[2].m_data[2] = 0.0;
  this->eps_tilde_1_i[3].m_data[0] = 0.0;
  this->eps_tilde_1_i[3].m_data[1] = 0.0;
  this->eps_tilde_1_i[3].m_data[2] = 0.0;
  this->eps_tilde_1_i[0].m_data[0] = 0.0;
  this->eps_tilde_1_i[0].m_data[1] = 0.0;
  this->eps_tilde_1_i[0].m_data[2] = 0.0;
  this->eps_tilde_1_i[1].m_data[0] = 0.0;
  this->eps_tilde_1_i[1].m_data[1] = 0.0;
  this->eps_tilde_1_i[1].m_data[2] = 0.0;
  this->eps_tilde_1_i[2].m_data[0] = 0.0;
  this->eps_tilde_1_i[2].m_data[1] = 0.0;
  this->eps_tilde_2_i[1].m_data[1] = 0.0;
  this->eps_tilde_2_i[1].m_data[2] = 0.0;
  this->eps_tilde_2_i[2].m_data[0] = 0.0;
  this->eps_tilde_2_i[2].m_data[1] = 0.0;
  this->eps_tilde_2_i[2].m_data[2] = 0.0;
  this->eps_tilde_2_i[3].m_data[0] = 0.0;
  this->eps_tilde_2_i[3].m_data[1] = 0.0;
  this->eps_tilde_2_i[3].m_data[2] = 0.0;
  this->eps_tilde_2_i[0].m_data[0] = 0.0;
  this->eps_tilde_2_i[0].m_data[1] = 0.0;
  this->eps_tilde_2_i[0].m_data[2] = 0.0;
  this->eps_tilde_2_i[1].m_data[0] = 0.0;
  this->eps_tilde_2_i[1].m_data[1] = 0.0;
  this->eps_tilde_2_i[1].m_data[2] = 0.0;
  this->eps_tilde_2_i[2].m_data[0] = 0.0;
  this->eps_tilde_2_i[2].m_data[1] = 0.0;
  this->eps_tilde_1_A[1].m_data[1] = 0.0;
  this->eps_tilde_1_A[1].m_data[2] = 0.0;
  this->eps_tilde_1_A[2].m_data[0] = 0.0;
  this->eps_tilde_1_A[2].m_data[1] = 0.0;
  this->eps_tilde_1_A[2].m_data[2] = 0.0;
  this->eps_tilde_1_A[3].m_data[0] = 0.0;
  this->eps_tilde_1_A[3].m_data[1] = 0.0;
  this->eps_tilde_1_A[3].m_data[2] = 0.0;
  this->eps_tilde_1_A[0].m_data[0] = 0.0;
  this->eps_tilde_1_A[0].m_data[1] = 0.0;
  this->eps_tilde_1_A[0].m_data[2] = 0.0;
  this->eps_tilde_1_A[1].m_data[0] = 0.0;
  this->eps_tilde_1_A[1].m_data[1] = 0.0;
  this->eps_tilde_1_A[1].m_data[2] = 0.0;
  this->eps_tilde_1_A[2].m_data[0] = 0.0;
  this->eps_tilde_1_A[2].m_data[1] = 0.0;
  this->eps_tilde_2_A[1].m_data[1] = 0.0;
  this->eps_tilde_2_A[1].m_data[2] = 0.0;
  this->eps_tilde_2_A[2].m_data[0] = 0.0;
  this->eps_tilde_2_A[2].m_data[1] = 0.0;
  this->eps_tilde_2_A[2].m_data[2] = 0.0;
  this->eps_tilde_2_A[3].m_data[0] = 0.0;
  this->eps_tilde_2_A[3].m_data[1] = 0.0;
  this->eps_tilde_2_A[3].m_data[2] = 0.0;
  this->eps_tilde_2_A[0].m_data[0] = 0.0;
  this->eps_tilde_2_A[0].m_data[1] = 0.0;
  this->eps_tilde_2_A[0].m_data[2] = 0.0;
  this->eps_tilde_2_A[1].m_data[0] = 0.0;
  this->eps_tilde_2_A[1].m_data[1] = 0.0;
  this->eps_tilde_2_A[1].m_data[2] = 0.0;
  this->eps_tilde_2_A[2].m_data[0] = 0.0;
  this->eps_tilde_2_A[2].m_data[1] = 0.0;
  this->k_tilde_1_0_i[1].m_data[1] = 0.0;
  this->k_tilde_1_0_i[1].m_data[2] = 0.0;
  this->k_tilde_1_0_i[2].m_data[0] = 0.0;
  this->k_tilde_1_0_i[2].m_data[1] = 0.0;
  this->k_tilde_1_0_i[2].m_data[2] = 0.0;
  this->k_tilde_1_0_i[3].m_data[0] = 0.0;
  this->k_tilde_1_0_i[3].m_data[1] = 0.0;
  this->k_tilde_1_0_i[3].m_data[2] = 0.0;
  this->k_tilde_1_0_i[0].m_data[0] = 0.0;
  this->k_tilde_1_0_i[0].m_data[1] = 0.0;
  this->k_tilde_1_0_i[0].m_data[2] = 0.0;
  this->k_tilde_1_0_i[1].m_data[0] = 0.0;
  this->k_tilde_1_0_i[1].m_data[1] = 0.0;
  this->k_tilde_1_0_i[1].m_data[2] = 0.0;
  this->k_tilde_1_0_i[2].m_data[0] = 0.0;
  this->k_tilde_1_0_i[2].m_data[1] = 0.0;
  this->k_tilde_2_0_i[1].m_data[1] = 0.0;
  this->k_tilde_2_0_i[1].m_data[2] = 0.0;
  this->k_tilde_2_0_i[2].m_data[0] = 0.0;
  this->k_tilde_2_0_i[2].m_data[1] = 0.0;
  this->k_tilde_2_0_i[2].m_data[2] = 0.0;
  this->k_tilde_2_0_i[3].m_data[0] = 0.0;
  this->k_tilde_2_0_i[3].m_data[1] = 0.0;
  this->k_tilde_2_0_i[3].m_data[2] = 0.0;
  this->k_tilde_2_0_i[0].m_data[0] = 0.0;
  this->k_tilde_2_0_i[0].m_data[1] = 0.0;
  this->k_tilde_2_0_i[0].m_data[2] = 0.0;
  this->k_tilde_2_0_i[1].m_data[0] = 0.0;
  this->k_tilde_2_0_i[1].m_data[1] = 0.0;
  this->k_tilde_2_0_i[1].m_data[2] = 0.0;
  this->k_tilde_2_0_i[2].m_data[0] = 0.0;
  this->k_tilde_2_0_i[2].m_data[1] = 0.0;
  this->k_tilde_1_i[1].m_data[1] = 0.0;
  this->k_tilde_1_i[1].m_data[2] = 0.0;
  this->k_tilde_1_i[2].m_data[0] = 0.0;
  this->k_tilde_1_i[2].m_data[1] = 0.0;
  this->k_tilde_1_i[2].m_data[2] = 0.0;
  this->k_tilde_1_i[3].m_data[0] = 0.0;
  this->k_tilde_1_i[3].m_data[1] = 0.0;
  this->k_tilde_1_i[3].m_data[2] = 0.0;
  this->k_tilde_1_i[0].m_data[0] = 0.0;
  this->k_tilde_1_i[0].m_data[1] = 0.0;
  this->k_tilde_1_i[0].m_data[2] = 0.0;
  this->k_tilde_1_i[1].m_data[0] = 0.0;
  this->k_tilde_1_i[1].m_data[1] = 0.0;
  this->k_tilde_1_i[1].m_data[2] = 0.0;
  this->k_tilde_1_i[2].m_data[0] = 0.0;
  this->k_tilde_1_i[2].m_data[1] = 0.0;
  this->k_tilde_2_i[1].m_data[1] = 0.0;
  this->k_tilde_2_i[1].m_data[2] = 0.0;
  this->k_tilde_2_i[2].m_data[0] = 0.0;
  this->k_tilde_2_i[2].m_data[1] = 0.0;
  this->k_tilde_2_i[2].m_data[2] = 0.0;
  this->k_tilde_2_i[3].m_data[0] = 0.0;
  this->k_tilde_2_i[3].m_data[1] = 0.0;
  this->k_tilde_2_i[3].m_data[2] = 0.0;
  this->k_tilde_2_i[0].m_data[0] = 0.0;
  this->k_tilde_2_i[0].m_data[1] = 0.0;
  this->k_tilde_2_i[0].m_data[2] = 0.0;
  this->k_tilde_2_i[1].m_data[0] = 0.0;
  this->k_tilde_2_i[1].m_data[1] = 0.0;
  this->k_tilde_2_i[1].m_data[2] = 0.0;
  this->k_tilde_2_i[2].m_data[0] = 0.0;
  this->k_tilde_2_i[2].m_data[1] = 0.0;
  this->y_i_1[1].m_data[1] = 0.0;
  this->y_i_1[1].m_data[2] = 0.0;
  this->y_i_1[2].m_data[0] = 0.0;
  this->y_i_1[2].m_data[1] = 0.0;
  this->y_i_1[2].m_data[2] = 0.0;
  this->y_i_1[3].m_data[0] = 0.0;
  this->y_i_1[3].m_data[1] = 0.0;
  this->y_i_1[3].m_data[2] = 0.0;
  this->y_i_1[0].m_data[0] = 0.0;
  this->y_i_1[0].m_data[1] = 0.0;
  this->y_i_1[0].m_data[2] = 0.0;
  this->y_i_1[1].m_data[0] = 0.0;
  this->y_i_1[1].m_data[1] = 0.0;
  this->y_i_1[1].m_data[2] = 0.0;
  this->y_i_1[2].m_data[0] = 0.0;
  this->y_i_1[2].m_data[1] = 0.0;
  this->y_i_2[1].m_data[1] = 0.0;
  this->y_i_2[1].m_data[2] = 0.0;
  this->y_i_2[2].m_data[0] = 0.0;
  this->y_i_2[2].m_data[1] = 0.0;
  this->y_i_2[2].m_data[2] = 0.0;
  this->y_i_2[3].m_data[0] = 0.0;
  this->y_i_2[3].m_data[1] = 0.0;
  this->y_i_2[3].m_data[2] = 0.0;
  this->y_i_2[0].m_data[0] = 0.0;
  this->y_i_2[0].m_data[1] = 0.0;
  this->y_i_2[0].m_data[2] = 0.0;
  this->y_i_2[1].m_data[0] = 0.0;
  this->y_i_2[1].m_data[1] = 0.0;
  this->y_i_2[1].m_data[2] = 0.0;
  this->y_i_2[2].m_data[0] = 0.0;
  this->y_i_2[2].m_data[1] = 0.0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&this->m_nodes,4);
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_i[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_i[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_i[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  memset(this->B_overline_i,0,0x77a0);
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_A[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_A[1].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_A[2].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[0] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[1] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[2] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[3] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[4] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[5] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[6] = 0.0;
  this->L_alpha_beta_A[3].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.
  m_data.array[7] = 0.0;
  return;
}

Assistant:

ChElementShellReissner4::ChElementShellReissner4() : tot_thickness(0) {
    m_nodes.resize(4);

    // add here other constructor-time initializations
    for (int i = 0; i < NUMIP; i++) {
        L_alpha_beta_i[i].setZero();
        B_overline_i[i].setZero();
        D_overline_i[i].setZero();
        G_i[i].setZero();
        P_i[i].setZero();
    }

    for (int i = 0; i < NUMSSEP; i++)
        L_alpha_beta_A[i].setZero();
}